

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O1

int test_tcp(uint num_servers,uint num_clients)

{
  double dVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  void *__ptr;
  uv_tcp_t *__ptr_00;
  uv_loop_t *loop;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint *puVar7;
  ulong __nmemb;
  long lVar8;
  uint num_clients_00;
  uv_tcp_t *puVar9;
  uv_pipe_t *puVar10;
  uv_tcp_t *puVar11;
  uv_connect_t **handle;
  undefined8 uVar12;
  uv_sem_t *puVar13;
  void *arg;
  undefined1 auVar14 [16];
  uv_tcp_t local_248;
  uint local_140;
  uv_pipe_t local_138;
  
  num_clients_00 = 0x23a3;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&listen_addr);
  if (iVar2 != 0) goto LAB_0010ba2e;
  puVar3 = uv_default_loop();
  __nmemb = (ulong)num_servers;
  __ptr = calloc(__nmemb,0x1b8);
  num_clients_00 = 0x1e8;
  __ptr_00 = (uv_tcp_t *)calloc(0x28,0x1e8);
  if (__ptr == (void *)0x0) goto LAB_0010ba33;
  if (__ptr_00 == (uv_tcp_t *)0x0) goto LAB_0010ba38;
  uVar6 = __nmemb;
  arg = __ptr;
  if (num_servers != 0) {
    do {
      num_clients_00 = 0;
      iVar2 = uv_sem_init((uv_sem_t *)((long)arg + 0x198),0);
      if (iVar2 != 0) goto LAB_0010ba24;
      num_clients_00 = 0x10ba88;
      iVar2 = uv_thread_create((uv_thread_t *)((long)arg + 400),server_cb,arg);
      if (iVar2 != 0) goto LAB_0010ba1f;
      uVar6 = uVar6 - 1;
      arg = (void *)((long)arg + 0x1b8);
    } while (uVar6 != 0);
  }
  loop = uv_default_loop();
  puVar9 = &local_248;
  local_140 = num_servers;
  iVar2 = uv_tcp_init(loop,puVar9);
  num_clients_00 = (uint)puVar9;
  if (iVar2 != 0) goto LAB_0010ba3d;
  num_clients_00 = 0x136840;
  iVar2 = uv_tcp_bind(&local_248,(sockaddr *)&listen_addr,0);
  if (iVar2 != 0) goto LAB_0010ba42;
  puVar10 = &local_138;
  iVar2 = uv_pipe_init(loop,&local_138,0);
  num_clients_00 = (uint)puVar10;
  if (iVar2 != 0) goto LAB_0010ba47;
  num_clients_00 = 0x123f86;
  iVar2 = uv_pipe_bind(&local_138,"/tmp/uv-test-sock");
  if (iVar2 != 0) goto LAB_0010ba4c;
  num_clients_00 = 0x80;
  iVar2 = uv_listen((uv_stream_t *)&local_138,0x80,ipc_connection_cb);
  if (iVar2 != 0) goto LAB_0010ba51;
  if (num_servers != 0) {
    puVar13 = (uv_sem_t *)((long)__ptr + 0x198);
    uVar6 = __nmemb;
    do {
      uv_sem_post(puVar13);
      puVar13 = (uv_sem_t *)((long)puVar13 + 0x1b8);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  num_clients_00 = 0;
  iVar2 = uv_run(loop,UV_RUN_DEFAULT);
  if (iVar2 != 0) goto LAB_0010ba56;
  uv_close((uv_handle_t *)&local_248,(uv_close_cb)0x0);
  num_clients_00 = 0;
  iVar2 = uv_run(loop,UV_RUN_DEFAULT);
  if (iVar2 != 0) goto LAB_0010ba5b;
  if (num_servers != 0) {
    puVar13 = (uv_sem_t *)((long)__ptr + 0x198);
    uVar6 = __nmemb;
    do {
      uv_sem_wait(puVar13);
      puVar13 = (uv_sem_t *)((long)puVar13 + 0x1b8);
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  lVar8 = 0x28;
  puVar9 = __ptr_00;
  do {
    puVar9[1].type = 0x186a;
    puVar9->data = "client handle";
    puVar11 = puVar9;
    iVar2 = uv_tcp_init(puVar3,puVar9);
    num_clients_00 = (uint)puVar11;
    if (iVar2 != 0) {
LAB_0010ba1a:
      test_tcp_cold_11();
LAB_0010ba1f:
      test_tcp_cold_3();
LAB_0010ba24:
      test_tcp_cold_2();
      goto LAB_0010ba29;
    }
    puVar11 = puVar9;
    iVar2 = uv_tcp_connect((uv_connect_t *)&puVar9[1].close_cb,puVar9,(sockaddr *)&listen_addr,
                           cl_connect_cb);
    num_clients_00 = (uint)puVar11;
    if (iVar2 != 0) {
LAB_0010ba15:
      test_tcp_cold_12();
      goto LAB_0010ba1a;
    }
    handle = &puVar9[1].connect_req;
    iVar2 = uv_idle_init(puVar3,(uv_idle_t *)handle);
    num_clients_00 = (uint)handle;
    if (iVar2 != 0) {
      test_tcp_cold_13();
      goto LAB_0010ba15;
    }
    puVar9 = (uv_tcp_t *)&puVar9[1].queued_fds;
    lVar8 = lVar8 + -1;
  } while (lVar8 != 0);
  uVar4 = uv_hrtime();
  uVar12 = 0;
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  num_clients_00 = (uint)uVar12;
  if (iVar2 == 0) {
    uVar5 = uv_hrtime();
    if (num_servers != 0) {
      puVar13 = (uv_sem_t *)((long)__ptr + 0x198);
      uVar6 = __nmemb;
      do {
        uv_async_send((uv_async_t *)((long)puVar13 + -0x88));
        iVar2 = uv_thread_join((uv_thread_t *)((long)puVar13 + -8));
        num_clients_00 = (uint)uVar12;
        if (iVar2 != 0) goto LAB_0010ba29;
        uv_sem_destroy(puVar13);
        puVar13 = (uv_sem_t *)((long)puVar13 + 0x1b8);
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    lVar8 = uVar5 - uVar4;
    auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = 0x45300000;
    dVar1 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) / 1000000000.0;
    printf("accept%u: %.0f accepts/sec (%u total)\n",250000.0 / dVar1,(ulong)num_servers,250000);
    if (num_servers != 0) {
      puVar7 = (uint *)((long)__ptr + 0x108);
      uVar6 = 0;
      do {
        printf("  thread #%u: %.0f accepts/sec (%u total, %.1f%%)\n",(double)*puVar7 / dVar1,
               SUB84(((double)*puVar7 * 100.0) / 250000.0,0),uVar6 & 0xffffffff);
        uVar6 = uVar6 + 1;
        puVar7 = puVar7 + 0x6e;
      } while (__nmemb != uVar6);
    }
    free(__ptr_00);
    free(__ptr);
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    num_clients_00 = 0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return extraout_EAX;
    }
    goto LAB_0010ba65;
  }
  goto LAB_0010ba60;
LAB_0010ba29:
  test_tcp_cold_15();
LAB_0010ba2e:
  test_tcp_cold_1();
LAB_0010ba33:
  test_tcp_cold_18();
LAB_0010ba38:
  test_tcp_cold_17();
LAB_0010ba3d:
  test_tcp_cold_4();
LAB_0010ba42:
  test_tcp_cold_5();
LAB_0010ba47:
  test_tcp_cold_6();
LAB_0010ba4c:
  test_tcp_cold_7();
LAB_0010ba51:
  test_tcp_cold_8();
LAB_0010ba56:
  test_tcp_cold_9();
LAB_0010ba5b:
  test_tcp_cold_10();
LAB_0010ba60:
  test_tcp_cold_14();
LAB_0010ba65:
  test_tcp_cold_16();
  test_tcp(4,num_clients_00);
  return 0;
}

Assistant:

static int test_tcp(unsigned int num_servers, unsigned int num_clients) {
  struct server_ctx* servers;
  struct client_ctx* clients;
  uv_loop_t* loop;
  uv_tcp_t* handle;
  unsigned int i;
  double time;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &listen_addr));
  loop = uv_default_loop();

  servers = calloc(num_servers, sizeof(servers[0]));
  clients = calloc(num_clients, sizeof(clients[0]));
  ASSERT_NOT_NULL(servers);
  ASSERT_NOT_NULL(clients);

  /* We're making the assumption here that from the perspective of the
   * OS scheduler, threads are functionally equivalent to and interchangeable
   * with full-blown processes.
   */
  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    ASSERT(0 == uv_sem_init(&ctx->semaphore, 0));
    ASSERT(0 == uv_thread_create(&ctx->thread_id, server_cb, ctx));
  }

  send_listen_handles(UV_TCP, num_servers, servers);

  for (i = 0; i < num_clients; i++) {
    struct client_ctx* ctx = clients + i;
    ctx->num_connects = NUM_CONNECTS / num_clients;
    handle = (uv_tcp_t*) &ctx->client_handle;
    handle->data = "client handle";
    ASSERT(0 == uv_tcp_init(loop, handle));
    ASSERT(0 == uv_tcp_connect(&ctx->connect_req,
                               handle,
                               (const struct sockaddr*) &listen_addr,
                               cl_connect_cb));
    ASSERT(0 == uv_idle_init(loop, &ctx->idle_handle));
  }

  {
    uint64_t t = uv_hrtime();
    ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
    t = uv_hrtime() - t;
    time = t / 1e9;
  }

  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    uv_async_send(&ctx->async_handle);
    ASSERT(0 == uv_thread_join(&ctx->thread_id));
    uv_sem_destroy(&ctx->semaphore);
  }

  printf("accept%u: %.0f accepts/sec (%u total)\n",
         num_servers,
         NUM_CONNECTS / time,
         NUM_CONNECTS);

  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    printf("  thread #%u: %.0f accepts/sec (%u total, %.1f%%)\n",
           i,
           ctx->num_connects / time,
           ctx->num_connects,
           ctx->num_connects * 100.0 / NUM_CONNECTS);
  }

  free(clients);
  free(servers);

  MAKE_VALGRIND_HAPPY();
  return 0;
}